

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_socket_manager.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::utp_socket_manager::remove_udp_socket
          (utp_socket_manager *this,weak_ptr<libtorrent::aux::utp_socket_interface> *sock)

{
  int iVar1;
  _Base_ptr p_Var2;
  _Base_ptr this_00;
  int iVar3;
  _Atomic_word _Var4;
  _Rb_tree_node_base *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar6;
  element_type *peVar7;
  bool bVar8;
  
  this_01 = (sock->
            super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    iVar3 = this_01->_M_use_count;
    peVar6 = (element_type *)0x0;
    do {
      if (iVar3 == 0) {
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        goto LAB_0038a3b2;
      }
      LOCK();
      iVar1 = this_01->_M_use_count;
      bVar8 = iVar3 == iVar1;
      if (bVar8) {
        this_01->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar8);
    if (this_01->_M_use_count != 0) {
      peVar6 = (sock->
               super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      goto LAB_0038a3b2;
    }
  }
  peVar6 = (element_type *)0x0;
LAB_0038a3b2:
  p_Var5 = (this->m_utp_sockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var5 == &(this->m_utp_sockets)._M_t._M_impl.super__Rb_tree_header) {
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        return;
      }
      return;
    }
    p_Var2 = p_Var5[1]._M_parent;
    this_00 = p_Var2->_M_parent;
    if (this_00 == (_Base_ptr)0x0) {
LAB_0038a3e9:
      if (peVar6 == (element_type *)0x0) {
LAB_0038a3fd:
        utp_socket_impl::abort((utp_socket_impl *)p_Var5[1]._M_parent);
      }
    }
    else {
      _Var4 = *(_Atomic_word *)&this_00->_M_parent;
      do {
        if (_Var4 == 0) goto LAB_0038a3e9;
        LOCK();
        iVar3 = *(int *)&this_00->_M_parent;
        bVar8 = _Var4 == iVar3;
        if (bVar8) {
          *(_Atomic_word *)&this_00->_M_parent = _Var4 + 1;
          iVar3 = _Var4;
        }
        _Var4 = iVar3;
        UNLOCK();
      } while (!bVar8);
      if (*(int *)&this_00->_M_parent == 0) {
        peVar7 = (element_type *)0x0;
      }
      else {
        peVar7 = *(element_type **)p_Var2;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      if (peVar7 == peVar6) goto LAB_0038a3fd;
    }
    p_Var5 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

void utp_socket_manager::remove_udp_socket(std::weak_ptr<utp_socket_interface> sock)
	{
		auto iface = sock.lock();
		for (auto& s : m_utp_sockets)
		{
			if (s.second->m_sock.lock() != iface)
				continue;

			s.second->abort();
		}
	}